

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O3

ion_bpp_err_t b_find_next_key(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ion_bpp_node_t *piVar1;
  ion_bpp_buffer_t *piVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_key_t *__src;
  ion_bpp_buffer_t *buf;
  ion_bpp_buffer_t *local_30;
  
  local_30 = *(ion_bpp_buffer_t **)((long)handle + 0xa8);
  if (local_30 == (ion_bpp_buffer_t *)0x0) {
    return bErrKeyNotFound;
  }
  piVar1 = local_30->p;
  if (*(undefined1 **)((long)handle + 0xb0) ==
      &piVar1->fkey + ((ulong)(*(ushort *)piVar1 >> 1) - 1) * (long)*(int *)((long)handle + 0xbc)) {
    if (piVar1->next == 0) {
      return bErrKeyNotFound;
    }
    iVar3 = readDisk(handle,piVar1->next,&local_30);
    if (iVar3 != bErrOk) {
      return iVar3;
    }
    __src = &local_30->p->fkey;
  }
  else {
    __src = *(undefined1 **)((long)handle + 0xb0) + *(int *)((long)handle + 0xbc);
  }
  piVar2 = local_30;
  memcpy(key,__src,(long)*(int *)((long)handle + 8));
  *rec = *(ion_bpp_external_address_t *)(__src + *(int *)((long)handle + 8));
  *(ion_bpp_buffer_t **)((long)handle + 0xa8) = piVar2;
  *(ion_bpp_key_t **)((long)handle + 0xb0) = __src;
  return bErrOk;
}

Assistant:

ion_bpp_err_t
b_find_next_key(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_key_t		*nkey;			/* next key */
	ion_bpp_buffer_t	*buf;				/* buffer */

	ion_bpp_h_node_t *h = handle;

	if ((buf = h->curBuf) == NULL) {
		return bErrKeyNotFound;
	}

	if (h->curKey == lkey(buf)) {
		/* current key is last key in leaf node */
		if (next(buf)) {
			/* fetch next set */
			if ((rc = readDisk(handle, next(buf), &buf)) != 0) {
				return rc;
			}

			nkey = fkey(buf);
		}
		else {
			/* no more sets */
			return bErrKeyNotFound;
		}
	}
	else {
		/* bump to next key */
		nkey = h->curKey + ks(1);
	}

	memcpy(key, key(nkey), h->keySize);
	*rec		= rec(nkey);
	h->curBuf	= buf;
	h->curKey	= nkey;
	return bErrOk;
}